

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O0

void print_buffer(char *buffer,size_t size)

{
  size_t local_20;
  size_t i;
  size_t size_local;
  char *buffer_local;
  
  printf("%.*s [",size & 0xffffffff,buffer);
  for (local_20 = 0; local_20 != size; local_20 = local_20 + 1) {
    printf("<0x%02X>",(ulong)(byte)buffer[local_20]);
    if (buffer[local_20] == '\n') {
      printf("%c",10);
    }
  }
  printf("]");
  return;
}

Assistant:

static void print_buffer(const char *buffer, size_t size) {
	size_t i;

	printf("%.*s [", (int)size, buffer);
	for (i = 0; i != size; ++i) {
		printf("<" COLOR_BOLD "0x%02X" COLOR_UNBOLD ">", (unsigned char)buffer[i]);
		if(buffer[i] == '\n') printf("%c", '\n');
	}
	printf("]");
}